

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_renderhacks.cpp
# Opt level: O2

void __thiscall
FDrawInfo::AddOtherCeilingPlane(FDrawInfo *this,int sector,gl_subsectorrendernode *node)

{
  uint uVar1;
  gl_subsectorrendernode **ppgVar2;
  long lVar3;
  TArray<gl_subsectorrendernode_*,_gl_subsectorrendernode_*> *this_00;
  
  uVar1 = (this->otherceilingplanes).Count;
  lVar3 = (long)(int)uVar1;
  this_00 = &this->otherceilingplanes;
  if ((int)uVar1 <= sector) {
    TArray<gl_subsectorrendernode_*,_gl_subsectorrendernode_*>::Resize(this_00,sector + 1);
    for (; lVar3 <= sector; lVar3 = lVar3 + 1) {
      this_00->Array[lVar3] = (gl_subsectorrendernode *)0x0;
    }
  }
  ppgVar2 = this_00->Array;
  node->next = ppgVar2[sector];
  ppgVar2[sector] = node;
  return;
}

Assistant:

void FDrawInfo::AddOtherCeilingPlane(int sector, gl_subsectorrendernode * node)
{
	int oldcnt = otherceilingplanes.Size();

	if (oldcnt<=sector)
	{
		otherceilingplanes.Resize(sector+1);
		for(int i=oldcnt;i<=sector;i++) otherceilingplanes[i]=NULL;
	}
	node->next = otherceilingplanes[sector];
	otherceilingplanes[sector] = node;
}